

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

void icetImageAdjustForInput(IceTImage image)

{
  IceTBoolean IVar1;
  IceTSizeType width;
  IceTSizeType height;
  IceTEnum local_18;
  IceTEnum local_14;
  IceTEnum depth_format;
  IceTEnum color_format;
  IceTImage image_local;
  
  _depth_format = image.opaque_internals;
  IVar1 = icetImageIsNull(image);
  if (IVar1 == '\0') {
    icetGetEnumv(9,&local_14);
    icetGetEnumv(10,&local_18);
    *(IceTEnum *)((long)_depth_format + 4) = local_14;
    *(IceTEnum *)((long)_depth_format + 8) = local_18;
    width = icetImageGetWidth(_depth_format);
    height = icetImageGetHeight(_depth_format);
    icetImageSetDimensions(_depth_format,width,height);
  }
  return;
}

Assistant:

void icetImageAdjustForInput(IceTImage image)
{
    IceTEnum color_format, depth_format;

    if (icetImageIsNull(image)) return;

    ICET_TEST_IMAGE_HEADER(image);

    icetGetEnumv(ICET_COLOR_FORMAT, &color_format);
    icetGetEnumv(ICET_DEPTH_FORMAT, &depth_format);

  /* Reset to the specified image format. */
    ICET_IMAGE_HEADER(image)[ICET_IMAGE_COLOR_FORMAT_INDEX] = color_format;
    ICET_IMAGE_HEADER(image)[ICET_IMAGE_DEPTH_FORMAT_INDEX] = depth_format;

  /* Reset the image size (changes actual buffer size). */
    icetImageSetDimensions(image,
                           icetImageGetWidth(image),
                           icetImageGetHeight(image));
}